

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O3

void __thiscall tcu::FileResource::FileResource(FileResource *this,char *filename)

{
  FILE *pFVar1;
  ResourceError *this_00;
  allocator<char> local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,filename,&local_49);
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__Resource_003f27f8;
  (this->super_Resource).m_name._M_dataplus._M_p = (pointer)&(this->super_Resource).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Resource).m_name,local_48,local_40 + (long)local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__FileResource_003f2728;
  pFVar1 = fopen(filename,"rb");
  this->m_file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  ResourceError::ResourceError
            (this_00,"Failed to open file",filename,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuResource.cpp"
             ,0x35);
  __cxa_throw(this_00,&ResourceError::typeinfo,Exception::~Exception);
}

Assistant:

FileResource::FileResource (const char* filename)
	: Resource(std::string(filename))
{
	m_file = fopen(filename, "rb");
	if (!m_file)
		throw ResourceError("Failed to open file", filename, __FILE__, __LINE__);
}